

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFARegExec(xmlRegexpPtr comp,xmlChar *content)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegStatePtr pxVar3;
  xmlRegStatePtr pxVar4;
  int *piVar5;
  xmlRegTrans *pxVar6;
  xmlRegCounter *pxVar7;
  bool bVar8;
  bool local_120;
  int local_11c;
  int i;
  xmlRegCounterPtr counter_2;
  xmlRegStatePtr state;
  int transno;
  xmlRegCounterPtr counter_1;
  xmlRegStatePtr to;
  xmlRegCounterPtr counter;
  int count;
  xmlRegAtomPtr atom;
  xmlRegTransPtr trans;
  int deter;
  int len;
  int codepoint;
  int ret;
  xmlRegExecCtxtPtr exec;
  xmlRegExecCtxt execval;
  xmlChar *content_local;
  xmlRegexpPtr comp_local;
  
  _codepoint = (xmlRegExecCtxtPtr)&exec;
  deter = 0;
  execval.charStack = (int *)content;
  execval.inputStackMax = 0;
  execval.errCounts._0_4_ = 0;
  exec._4_4_ = 1;
  execval.transno = 0;
  execval.transcount = 0;
  execval.maxRollbacks = 0;
  execval.nbRollbacks = 0;
  exec._0_4_ = 0;
  execval._0_8_ = comp;
  execval.data = *comp->states;
  execval.state._0_4_ = 0;
  execval.state._4_4_ = 0;
  execval.inputString = (xmlChar *)0x0;
  execval.counts._0_4_ = 0;
  execval._144_8_ = content;
  if (comp->nbCounters < 1) {
    execval.rollbacks = (xmlRegExecRollback *)0x0;
  }
  else {
    piVar5 = (int *)(*xmlMalloc)((long)comp->nbCounters << 2);
    _codepoint->counts = piVar5;
    if (_codepoint->counts == (int *)0x0) {
      return -5;
    }
    memset(_codepoint->counts,0,(long)comp->nbCounters << 2);
  }
LAB_001b26b8:
  bVar8 = false;
  if ((((_codepoint->status == 0) && (bVar8 = false, _codepoint->state != (xmlRegStatePtr)0x0)) &&
      (bVar8 = true, _codepoint->inputString[_codepoint->index] == '\0')) &&
     (bVar8 = false, _codepoint->state != (xmlRegStatePtr)0x0)) {
    bVar8 = _codepoint->state->type != XML_REGEXP_FINAL_STATE;
  }
  if (!bVar8) {
LAB_001b309f:
    if (_codepoint->rollbacks != (xmlRegExecRollback *)0x0) {
      if (_codepoint->counts != (int *)0x0) {
        for (local_11c = 0; local_11c < _codepoint->maxRollbacks; local_11c = local_11c + 1) {
          if (_codepoint->rollbacks[local_11c].counts != (int *)0x0) {
            (*xmlFree)(_codepoint->rollbacks[local_11c].counts);
          }
        }
      }
      (*xmlFree)(_codepoint->rollbacks);
    }
    if (_codepoint->state == (xmlRegStatePtr)0x0) {
      comp_local._4_4_ = -4;
    }
    else {
      if (_codepoint->counts != (int *)0x0) {
        (*xmlFree)(_codepoint->counts);
      }
      if (_codepoint->status == 0) {
        comp_local._4_4_ = 1;
      }
      else if (_codepoint->status == -1) {
        comp_local._4_4_ = 0;
      }
      else {
        comp_local._4_4_ = _codepoint->status;
      }
    }
    return comp_local._4_4_;
  }
  trans._4_4_ = 1;
  if (((_codepoint->inputString[_codepoint->index] != '\0') || (_codepoint->counts != (int *)0x0))
     || ((_codepoint->transno < _codepoint->state->nbTrans &&
         ((pxVar6 = _codepoint->state->trans + _codepoint->transno, pxVar6->to < 0 ||
          ((pxVar2 = pxVar6->atom, pxVar2->min == 0 && (0 < pxVar2->max)))))))) goto LAB_001b282a;
  goto LAB_001b307c;
LAB_001b282a:
  _codepoint->transcount = 0;
  while (_codepoint->transno < _codepoint->state->nbTrans) {
    pxVar6 = _codepoint->state->trans + _codepoint->transno;
    if (-1 < pxVar6->to) {
      pxVar2 = pxVar6->atom;
      len = 0;
      trans._0_4_ = 1;
      if (pxVar6->count < 0) {
        if (pxVar2 == (xmlRegAtomPtr)0x0) {
          _codepoint->status = -4;
          break;
        }
        if (_codepoint->inputString[_codepoint->index] == '\0') {
          if ((pxVar2->min == 0) && (0 < pxVar2->max)) {
            _codepoint->transcount = 1;
            trans._4_4_ = 0;
            len = 1;
          }
        }
        else {
          trans._4_4_ = 4;
          deter = xmlGetUTF8Char(_codepoint->inputString + _codepoint->index,
                                 (int *)((long)&trans + 4));
          if (deter < 0) {
            _codepoint->status = -7;
            goto LAB_001b309f;
          }
          len = xmlRegCheckCharacter(pxVar2,deter);
          if (((len == 1) && (-1 < pxVar2->min)) && (0 < pxVar2->max)) {
            pxVar3 = comp->states[pxVar6->to];
            if (-1 < pxVar6->counter) {
              if (((_codepoint->counts == (int *)0x0) || (_codepoint->comp == (xmlRegexpPtr)0x0)) ||
                 (_codepoint->comp->counters == (xmlRegCounter *)0x0)) {
                _codepoint->status = -4;
                goto LAB_001b309f;
              }
              if (_codepoint->comp->counters[pxVar6->counter].max <=
                  _codepoint->counts[pxVar6->counter]) goto LAB_001b3047;
            }
            if ((_codepoint->transno + 1 < _codepoint->state->nbTrans) &&
               (xmlFARegExecSave(_codepoint), _codepoint->status != 0)) goto LAB_001b309f;
            if (-1 < pxVar6->counter) {
              _codepoint->counts[pxVar6->counter] = _codepoint->counts[pxVar6->counter] + 1;
            }
            _codepoint->transcount = 1;
            do {
              if (_codepoint->transcount == pxVar2->max) break;
              _codepoint->index = trans._4_4_ + _codepoint->index;
              if (_codepoint->inputString[_codepoint->index] == '\0') {
                _codepoint->index = _codepoint->index - trans._4_4_;
                break;
              }
              if (pxVar2->min <= _codepoint->transcount) {
                iVar1 = _codepoint->transno;
                pxVar4 = _codepoint->state;
                _codepoint->transno = -1;
                _codepoint->state = pxVar3;
                xmlFARegExecSave(_codepoint);
                if (_codepoint->status != 0) goto LAB_001b309f;
                _codepoint->transno = iVar1;
                _codepoint->state = pxVar4;
              }
              trans._4_4_ = 4;
              deter = xmlGetUTF8Char(_codepoint->inputString + _codepoint->index,
                                     (int *)((long)&trans + 4));
              if (deter < 0) {
                _codepoint->status = -7;
                goto LAB_001b309f;
              }
              len = xmlRegCheckCharacter(pxVar2,deter);
              _codepoint->transcount = _codepoint->transcount + 1;
            } while (len == 1);
            if (_codepoint->transcount < pxVar2->min) {
              len = 0;
            }
            if (len < 0) {
              len = 0;
            }
            if (len == 0) goto LAB_001b307c;
            if (-1 < pxVar6->counter) {
              if (_codepoint->counts == (int *)0x0) {
                _codepoint->status = -4;
                goto LAB_001b309f;
              }
              _codepoint->counts[pxVar6->counter] = _codepoint->counts[pxVar6->counter] + -1;
            }
          }
          else if (((len == 0) && (pxVar2->min == 0)) && (0 < pxVar2->max)) {
            _codepoint->transcount = 1;
            trans._4_4_ = 0;
            len = 1;
          }
        }
      }
      else {
        if (_codepoint->counts == (int *)0x0) {
          _codepoint->status = -4;
          goto LAB_001b309f;
        }
        pxVar7 = _codepoint->comp->counters + pxVar6->count;
        local_120 = false;
        if (pxVar7->min <= _codepoint->counts[pxVar6->count]) {
          local_120 = _codepoint->counts[pxVar6->count] <= pxVar7->max;
        }
        len = (int)local_120;
        if ((len != 0) && (pxVar7->min != pxVar7->max)) {
          trans._0_4_ = 0;
        }
      }
      if (len == 1) {
        if (((pxVar6->nd == 1) ||
            (((-1 < pxVar6->count && ((int)trans == 0)) &&
             (_codepoint->transno + 1 < _codepoint->state->nbTrans)))) &&
           (xmlFARegExecSave(_codepoint), _codepoint->status != 0)) goto LAB_001b309f;
        if (-1 < pxVar6->counter) {
          if (((_codepoint->counts == (int *)0x0) || (_codepoint->comp == (xmlRegexpPtr)0x0)) ||
             (_codepoint->comp->counters == (xmlRegCounter *)0x0)) {
            _codepoint->status = -4;
            goto LAB_001b309f;
          }
          if (_codepoint->comp->counters[pxVar6->counter].max <= _codepoint->counts[pxVar6->counter]
             ) goto LAB_001b3047;
          _codepoint->counts[pxVar6->counter] = _codepoint->counts[pxVar6->counter] + 1;
        }
        if ((-1 < pxVar6->count) && (pxVar6->count < 0x123456)) {
          if (_codepoint->counts == (int *)0x0) {
            _codepoint->status = -4;
            goto LAB_001b309f;
          }
          _codepoint->counts[pxVar6->count] = 0;
        }
        _codepoint->state = comp->states[pxVar6->to];
        _codepoint->transno = 0;
        if (pxVar6->atom != (xmlRegAtomPtr)0x0) {
          _codepoint->index = trans._4_4_ + _codepoint->index;
        }
        goto LAB_001b26b8;
      }
      if (len < 0) {
        _codepoint->status = -4;
        break;
      }
    }
LAB_001b3047:
    _codepoint->transno = _codepoint->transno + 1;
  }
  if ((_codepoint->transno != 0) || (_codepoint->state->nbTrans == 0)) {
LAB_001b307c:
    _codepoint->determinist = 0;
    xmlFARegExecRollBack(_codepoint);
  }
  goto LAB_001b26b8;
}

Assistant:

static int
xmlFARegExec(xmlRegexpPtr comp, const xmlChar *content) {
    xmlRegExecCtxt execval;
    xmlRegExecCtxtPtr exec = &execval;
    int ret, codepoint = 0, len, deter;

    exec->inputString = content;
    exec->index = 0;
    exec->nbPush = 0;
    exec->determinist = 1;
    exec->maxRollbacks = 0;
    exec->nbRollbacks = 0;
    exec->rollbacks = NULL;
    exec->status = XML_REGEXP_OK;
    exec->comp = comp;
    exec->state = comp->states[0];
    exec->transno = 0;
    exec->transcount = 0;
    exec->inputStack = NULL;
    exec->inputStackMax = 0;
    if (comp->nbCounters > 0) {
	exec->counts = (int *) xmlMalloc(comp->nbCounters * sizeof(int));
	if (exec->counts == NULL) {
	    return(XML_REGEXP_OUT_OF_MEMORY);
	}
        memset(exec->counts, 0, comp->nbCounters * sizeof(int));
    } else
	exec->counts = NULL;
    while ((exec->status == XML_REGEXP_OK) && (exec->state != NULL) &&
	   ((exec->inputString[exec->index] != 0) ||
	    ((exec->state != NULL) &&
	     (exec->state->type != XML_REGEXP_FINAL_STATE)))) {
	xmlRegTransPtr trans;
	xmlRegAtomPtr atom;

	/*
	 * If end of input on non-terminal state, rollback, however we may
	 * still have epsilon like transition for counted transitions
	 * on counters, in that case don't break too early.  Additionally,
	 * if we are working on a range like "AB{0,2}", where B is not present,
	 * we don't want to break.
	 */
	len = 1;
	if ((exec->inputString[exec->index] == 0) && (exec->counts == NULL)) {
	    /*
	     * if there is a transition, we must check if
	     *  atom allows minOccurs of 0
	     */
	    if (exec->transno < exec->state->nbTrans) {
	        trans = &exec->state->trans[exec->transno];
		if (trans->to >=0) {
		    atom = trans->atom;
		    if (!((atom->min == 0) && (atom->max > 0)))
		        goto rollback;
		}
	    } else
	        goto rollback;
	}

	exec->transcount = 0;
	for (;exec->transno < exec->state->nbTrans;exec->transno++) {
	    trans = &exec->state->trans[exec->transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    ret = 0;
	    deter = 1;
	    if (trans->count >= 0) {
		int count;
		xmlRegCounterPtr counter;

		if (exec->counts == NULL) {
		    exec->status = XML_REGEXP_INTERNAL_ERROR;
		    goto error;
		}
		/*
		 * A counted transition.
		 */

		count = exec->counts[trans->count];
		counter = &exec->comp->counters[trans->count];
		ret = ((count >= counter->min) && (count <= counter->max));
		if ((ret) && (counter->min != counter->max))
		    deter = 0;
	    } else if (atom == NULL) {
		exec->status = XML_REGEXP_INTERNAL_ERROR;
		break;
	    } else if (exec->inputString[exec->index] != 0) {
                len = 4;
                codepoint = xmlGetUTF8Char(&exec->inputString[exec->index],
                                           &len);
                if (codepoint < 0) {
                    exec->status = XML_REGEXP_INVALID_UTF8;
                    goto error;
                }
		ret = xmlRegCheckCharacter(atom, codepoint);
		if ((ret == 1) && (atom->min >= 0) && (atom->max > 0)) {
		    xmlRegStatePtr to = comp->states[trans->to];

		    /*
		     * this is a multiple input sequence
		     * If there is a counter associated increment it now.
		     * do not increment if the counter is already over the
		     * maximum limit in which case get to next transition
		     */
		    if (trans->counter >= 0) {
			xmlRegCounterPtr counter;

			if ((exec->counts == NULL) ||
			    (exec->comp == NULL) ||
			    (exec->comp->counters == NULL)) {
			    exec->status = XML_REGEXP_INTERNAL_ERROR;
			    goto error;
			}
			counter = &exec->comp->counters[trans->counter];
			if (exec->counts[trans->counter] >= counter->max)
			    continue; /* for loop on transitions */
                    }
                    /* Save before incrementing */
		    if (exec->state->nbTrans > exec->transno + 1) {
			xmlFARegExecSave(exec);
                        if (exec->status != XML_REGEXP_OK)
                            goto error;
		    }
		    if (trans->counter >= 0) {
			exec->counts[trans->counter]++;
		    }
		    exec->transcount = 1;
		    do {
			/*
			 * Try to progress as much as possible on the input
			 */
			if (exec->transcount == atom->max) {
			    break;
			}
			exec->index += len;
			/*
			 * End of input: stop here
			 */
			if (exec->inputString[exec->index] == 0) {
			    exec->index -= len;
			    break;
			}
			if (exec->transcount >= atom->min) {
			    int transno = exec->transno;
			    xmlRegStatePtr state = exec->state;

			    /*
			     * The transition is acceptable save it
			     */
			    exec->transno = -1; /* trick */
			    exec->state = to;
			    xmlFARegExecSave(exec);
                            if (exec->status != XML_REGEXP_OK)
                                goto error;
			    exec->transno = transno;
			    exec->state = state;
			}
                        len = 4;
                        codepoint = xmlGetUTF8Char(
                                &exec->inputString[exec->index], &len);
                        if (codepoint < 0) {
                            exec->status = XML_REGEXP_INVALID_UTF8;
                            goto error;
                        }
			ret = xmlRegCheckCharacter(atom, codepoint);
			exec->transcount++;
		    } while (ret == 1);
		    if (exec->transcount < atom->min)
			ret = 0;

		    /*
		     * If the last check failed but one transition was found
		     * possible, rollback
		     */
		    if (ret < 0)
			ret = 0;
		    if (ret == 0) {
			goto rollback;
		    }
		    if (trans->counter >= 0) {
			if (exec->counts == NULL) {
			    exec->status = XML_REGEXP_INTERNAL_ERROR;
			    goto error;
			}
			exec->counts[trans->counter]--;
		    }
		} else if ((ret == 0) && (atom->min == 0) && (atom->max > 0)) {
		    /*
		     * we don't match on the codepoint, but minOccurs of 0
		     * says that's ok.  Setting len to 0 inhibits stepping
		     * over the codepoint.
		     */
		    exec->transcount = 1;
		    len = 0;
		    ret = 1;
		}
	    } else if ((atom->min == 0) && (atom->max > 0)) {
	        /* another spot to match when minOccurs is 0 */
		exec->transcount = 1;
		len = 0;
		ret = 1;
	    }
	    if (ret == 1) {
		if ((trans->nd == 1) ||
		    ((trans->count >= 0) && (deter == 0) &&
		     (exec->state->nbTrans > exec->transno + 1))) {
		    xmlFARegExecSave(exec);
                    if (exec->status != XML_REGEXP_OK)
                        goto error;
		}
		if (trans->counter >= 0) {
		    xmlRegCounterPtr counter;

                    /* make sure we don't go over the counter maximum value */
		    if ((exec->counts == NULL) ||
			(exec->comp == NULL) ||
			(exec->comp->counters == NULL)) {
			exec->status = XML_REGEXP_INTERNAL_ERROR;
			goto error;
		    }
		    counter = &exec->comp->counters[trans->counter];
		    if (exec->counts[trans->counter] >= counter->max)
			continue; /* for loop on transitions */
		    exec->counts[trans->counter]++;
		}
		if ((trans->count >= 0) &&
		    (trans->count < REGEXP_ALL_COUNTER)) {
		    if (exec->counts == NULL) {
		        exec->status = XML_REGEXP_INTERNAL_ERROR;
			goto error;
		    }
		    exec->counts[trans->count] = 0;
		}
		exec->state = comp->states[trans->to];
		exec->transno = 0;
		if (trans->atom != NULL) {
		    exec->index += len;
		}
		goto progress;
	    } else if (ret < 0) {
		exec->status = XML_REGEXP_INTERNAL_ERROR;
		break;
	    }
	}
	if ((exec->transno != 0) || (exec->state->nbTrans == 0)) {
rollback:
	    /*
	     * Failed to find a way out
	     */
	    exec->determinist = 0;
	    xmlFARegExecRollBack(exec);
	}
progress:
	continue;
    }
error:
    if (exec->rollbacks != NULL) {
	if (exec->counts != NULL) {
	    int i;

	    for (i = 0;i < exec->maxRollbacks;i++)
		if (exec->rollbacks[i].counts != NULL)
		    xmlFree(exec->rollbacks[i].counts);
	}
	xmlFree(exec->rollbacks);
    }
    if (exec->state == NULL)
        return(XML_REGEXP_INTERNAL_ERROR);
    if (exec->counts != NULL)
	xmlFree(exec->counts);
    if (exec->status == XML_REGEXP_OK)
	return(1);
    if (exec->status == XML_REGEXP_NOT_FOUND)
	return(0);
    return(exec->status);
}